

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Index IVar3;
  uint uVar4;
  uint32_t uVar5;
  Index IVar6;
  Address AVar7;
  RelocType reloc_type;
  ulong uVar8;
  char *pcVar9;
  size_t size;
  ExprList *exprs_00;
  Opcode OVar10;
  Stream *pSVar11;
  TableInitExpr *init_expr;
  Var *var;
  Expr *pEVar12;
  _func_int **local_48;
  Expr *pEStack_40;
  
  pEVar1 = exprs->first_;
  do {
    if (pEVar1 == (Expr *)0x0) {
      return;
    }
    switch(pEVar1->type_) {
    case AtomicLoad:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_00156034;
    case AtomicRmw:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_00156034;
    case AtomicRmwCmpxchg:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_00156034;
    case AtomicStore:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_00156034;
    case AtomicNotify:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_00156034;
    case AtomicFence:
      WriteOpcode(this->stream_,(Opcode)0x196);
      pSVar11 = this->stream_;
      uVar5 = *(uint32_t *)&pEVar1->field_0x3c;
      pcVar9 = "consistency model";
      break;
    case AtomicWait:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
LAB_00156034:
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar11 = this->stream_;
      uVar5 = *(uint32_t *)&pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar9 = "memory offset";
      break;
    case Binary:
    case Compare:
    case Convert:
    case Ternary:
    case Unary:
      pSVar11 = this->stream_;
      OVar10.enum_ = *(Enum *)&pEVar1->field_0x3c;
      goto LAB_001563a2;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      if ((pEVar1->type_ != Block) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Block)) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
        ;
LAB_001567a9:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                      ,0x48,pcVar9);
      }
      goto LAB_00156387;
    case Br:
      WriteOpcode(this->stream_,(Opcode)0xc);
      if (pEVar1->type_ != Br) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      goto LAB_001560cc;
    case BrIf:
      WriteOpcode(this->stream_,(Opcode)0xd);
      if (pEVar1->type_ != BrIf) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
LAB_001560cc:
      if ((int)pEVar1[1].loc.filename.size_ != 0) {
LAB_00156680:
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      pSVar11 = this->stream_;
      uVar5 = pEVar1[1].loc.field_1.field_0.line;
      pcVar9 = "break depth";
      break;
    case BrOnExn:
      WriteOpcode(this->stream_,(Opcode)0xa);
      if ((int)pEVar1[1].loc.filename.size_ != 0) goto LAB_00156680;
      WriteU32Leb128(this->stream_,pEVar1[1].loc.field_1.field_0.line,"break depth");
      pSVar11 = this->stream_;
      uVar5 = Module::GetEventIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      pcVar9 = "event index";
      break;
    case BrTable:
      WriteOpcode(this->stream_,(Opcode)0xe);
      WriteU32Leb128(this->stream_,
                     (int)((ulong)((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ -
                                  (long)pEVar1[1]._vptr_Expr) >> 3) * 0x38e38e39,"num targets");
      pEVar2 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      for (pEVar12 = (Expr *)pEVar1[1]._vptr_Expr; pEVar12 != pEVar2;
          pEVar12 = (Expr *)&pEVar12[1].super_intrusive_list_base<wabt::Expr>) {
        if ((int)(pEVar12->loc).filename.size_ != 0) goto LAB_00156680;
        WriteU32Leb128(this->stream_,(pEVar12->loc).field_1.field_0.line,"break depth");
      }
      if (pEVar1[1].type_ != AtomicLoad) goto LAB_00156680;
      uVar5 = *(uint32_t *)&pEVar1[2]._vptr_Expr;
      pSVar11 = this->stream_;
      pcVar9 = "break depth for default";
      break;
    case Call:
      IVar6 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar11 = this->stream_;
      OVar10.enum_ = Call;
      goto LAB_00156071;
    case CallIndirect:
      IVar3 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      if (pEVar1->type_ != CallIndirect) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::CallIndirectExpr, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 3));
      pSVar11 = this->stream_;
      OVar10.enum_ = CallIndirect;
      goto LAB_001562d0;
    case Const:
      switch((int)pEVar1[1].loc.filename.size_) {
      case -5:
        WriteOpcode(this->stream_,(Opcode)0xe1);
        pSVar11 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pEStack_40 = *(Expr **)((long)&pEVar1[1].loc.field_1 + 8);
        pcVar9 = "v128 literal";
        goto LAB_001561b1;
      case -4:
        WriteOpcode(this->stream_,(Opcode)0x38);
        pSVar11 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pcVar9 = "f64 literal";
        size = 8;
        break;
      case -3:
        WriteOpcode(this->stream_,(Opcode)0x37);
        pSVar11 = this->stream_;
        local_48 = (_func_int **)CONCAT44(local_48._4_4_,pEVar1[1].loc.field_1.field_0.line);
        pcVar9 = "f32 literal";
        size = 4;
        break;
      case -2:
        WriteOpcode(this->stream_,(Opcode)0x36);
        WriteS64Leb128(this->stream_,pEVar1[1].loc.field_1.field_1.offset,"i64 literal");
        goto switchD_001559fa_default;
      case -1:
        WriteOpcode(this->stream_,(Opcode)0x35);
        pSVar11 = this->stream_;
        uVar5 = pEVar1[1].loc.field_1.field_0.line;
        pcVar9 = "i32 literal";
        goto LAB_00156402;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-writer.cc"
                      ,0x308,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      goto LAB_001561b6;
    case Drop:
      pSVar11 = this->stream_;
      OVar10.enum_ = Drop;
      goto LAB_001563a2;
    case GlobalGet:
      IVar6 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar11 = this->stream_;
      OVar10.enum_ = GlobalGet;
      goto LAB_001561db;
    case GlobalSet:
      IVar6 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar11 = this->stream_;
      OVar10.enum_ = GlobalSet;
LAB_001561db:
      WriteOpcode(pSVar11,OVar10);
      pcVar9 = "global.get global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_001561f1;
    case If:
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      if (pEVar1[4].loc.field_1.field_1.offset != 0) {
        exprs_00 = (ExprList *)&pEVar1[4].loc;
        WriteOpcode(this->stream_,(Opcode)0x5);
        goto LAB_00156395;
      }
      goto LAB_0015639a;
    case Load:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      goto LAB_001564d6;
    case LocalGet:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar11 = this->stream_;
      OVar10.enum_ = LocalGet;
      goto LAB_001565aa;
    case LocalSet:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar11 = this->stream_;
      OVar10.enum_ = LocalSet;
      goto LAB_001565aa;
    case LocalTee:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar11 = this->stream_;
      OVar10.enum_ = LocalTee;
LAB_001565aa:
      WriteOpcode(pSVar11,OVar10);
      pSVar11 = this->stream_;
      pcVar9 = "local index";
      break;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      if ((pEVar1->type_ != Loop) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Loop)) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
LAB_00156387:
      exprs_00 = (ExprList *)&pEVar1[3].loc.filename.size_;
LAB_00156395:
      WriteExprList(this,func,exprs_00);
LAB_0015639a:
      pSVar11 = this->stream_;
      OVar10.enum_ = End;
      goto LAB_001563a2;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      WriteU32Leb128(this->stream_,0,"memory.copy reserved");
      pSVar11 = this->stream_;
      uVar5 = 0;
      pcVar9 = "memory.copy reserved";
      break;
    case DataDrop:
      IVar6 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar11 = this->stream_;
      pcVar9 = "data.drop segment";
      goto LAB_00156152;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc9);
      pSVar11 = this->stream_;
      pcVar9 = "memory.fill reserved";
      goto LAB_0015617b;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x34);
      pSVar11 = this->stream_;
      pcVar9 = "memory.grow reserved";
      goto LAB_0015617b;
    case MemoryInit:
      IVar6 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc6);
      WriteU32Leb128(this->stream_,IVar6,"memory.init segment");
      pSVar11 = this->stream_;
      pcVar9 = "memory.init reserved";
      IVar6 = 0;
LAB_00156152:
      WriteU32Leb128(pSVar11,IVar6,pcVar9);
      this->has_data_segment_instruction_ = true;
      goto switchD_001559fa_default;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar11 = this->stream_;
      pcVar9 = "memory.size reserved";
LAB_0015617b:
      uVar5 = 0;
      break;
    case Nop:
      pSVar11 = this->stream_;
      OVar10.enum_ = Nop;
      goto LAB_001563a2;
    case RefIsNull:
      pSVar11 = this->stream_;
      OVar10.enum_ = RefIsNull;
      goto LAB_001563a2;
    case RefFunc:
      WriteOpcode(this->stream_,(Opcode)0xd4);
      if (pEVar1->type_ != RefFunc) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::RefFunc>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      IVar6 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      goto LAB_00156082;
    case RefNull:
      WriteOpcode(this->stream_,(Opcode)0xd2);
      if (pEVar1->type_ != RefNull) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::RefTypeExpr<wabt::ExprType::RefNull>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      pSVar11 = this->stream_;
      uVar5 = *(uint32_t *)&pEVar1->field_0x3c;
      pcVar9 = "ref.null type";
LAB_00156402:
      WriteS32Leb128(pSVar11,uVar5,pcVar9);
      goto switchD_001559fa_default;
    case Rethrow:
      pSVar11 = this->stream_;
      OVar10.enum_ = Rethrow;
      goto LAB_001563a2;
    case Return:
      pSVar11 = this->stream_;
      OVar10.enum_ = Return;
      goto LAB_001563a2;
    case ReturnCall:
      IVar6 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar11 = this->stream_;
      OVar10.enum_ = ReturnCall;
LAB_00156071:
      WriteOpcode(pSVar11,OVar10);
LAB_00156082:
      pcVar9 = "block type function index";
      reloc_type = First;
LAB_001561f1:
      WriteU32Leb128WithReloc(this,IVar6,pcVar9 + 0xb,reloc_type);
      goto switchD_001559fa_default;
    case ReturnCallIndirect:
      IVar3 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      if (pEVar1->type_ != ReturnCallIndirect) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::ReturnCallIndirectExpr, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 3));
      pSVar11 = this->stream_;
      OVar10.enum_ = ReturnCallIndirect;
LAB_001562d0:
      WriteOpcode(pSVar11,OVar10);
      WriteU32Leb128WithReloc(this,IVar3,"signature index",TypeIndexLEB);
      pcVar9 = "table index";
      goto LAB_00156524;
    case Select:
      pSVar11 = this->stream_;
      if ((Expr *)pEVar1[1]._vptr_Expr == pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_) {
        OVar10.enum_ = Select;
        goto LAB_001563a2;
      }
      WriteOpcode(pSVar11,(Opcode)0x16);
      WriteU32Leb128(this->stream_,
                     (uint32_t)
                     ((ulong)((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ -
                             (long)pEVar1[1]._vptr_Expr) >> 2),"num result types");
      pEVar2 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      for (pEVar12 = (Expr *)pEVar1[1]._vptr_Expr; pEVar12 != pEVar2;
          pEVar12 = (Expr *)((long)&pEVar12->_vptr_Expr + 4)) {
        WriteS32Leb128(this->stream_,*(uint32_t *)&pEVar12->_vptr_Expr,"result type");
      }
      goto switchD_001559fa_default;
    case SimdLaneOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdLaneOp) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdLaneOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      Stream::WriteU8(this->stream_,(uint)*(byte *)&pEVar1[1]._vptr_Expr,"Simd Lane literal",No);
      goto switchD_001559fa_default;
    case SimdShuffleOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdShuffleOp) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdShuffleOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      pSVar11 = this->stream_;
      local_48 = pEVar1[1]._vptr_Expr;
      pEStack_40 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar9 = "Simd Lane[16] literal";
LAB_001561b1:
      size = 0x10;
LAB_001561b6:
      Stream::WriteData(pSVar11,&local_48,size,pcVar9,No);
      goto switchD_001559fa_default;
    case LoadSplat:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
LAB_001564d6:
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar11 = this->stream_;
      uVar5 = *(uint32_t *)&pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar9 = "load offset";
      break;
    case Store:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar7 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,(Address)pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < (uint)AVar7) {
        uVar5 = 0;
        uVar8 = AVar7 & 0xffffffff;
        do {
          uVar8 = uVar8 >> 1;
          uVar5 = uVar5 + 1;
          uVar4 = (uint)AVar7;
          AVar7 = uVar8;
        } while (3 < uVar4);
      }
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar11 = this->stream_;
      uVar5 = *(uint32_t *)&pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar9 = "store offset";
      break;
    case TableCopy:
      IVar3 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      IVar6 = Module::GetTableIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      WriteOpcode(this->stream_,(Opcode)0xcc);
      WriteTableNumberWithReloc(this,IVar3,"table.copy dst_table");
      pcVar9 = "table.copy src_table";
      goto LAB_00156524;
    case ElemDrop:
      uVar5 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar11 = this->stream_;
      pcVar9 = "elem.drop segment";
      break;
    case TableInit:
      IVar6 = Module::GetTableIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      IVar3 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xca);
      WriteU32Leb128(this->stream_,IVar3,"table.init segment");
      pcVar9 = "table.init table";
      goto LAB_00156524;
    case TableGet:
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcd);
      pcVar9 = "table.get table index";
      goto LAB_00156524;
    case TableGrow:
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcf);
      pcVar9 = "table.grow table index";
      goto LAB_00156524;
    case TableSize:
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xd0);
      pcVar9 = "table.size table index";
      goto LAB_00156524;
    case TableSet:
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xce);
      pcVar9 = "table.set table index";
      goto LAB_00156524;
    case TableFill:
      IVar6 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xd1);
      pcVar9 = "table.fill table index";
LAB_00156524:
      WriteTableNumberWithReloc(this,IVar6,pcVar9);
      goto switchD_001559fa_default;
    case Throw:
      WriteOpcode(this->stream_,(Opcode)0x8);
      if (pEVar1->type_ != Throw) {
        pcVar9 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Throw>, Base = wabt::Expr]"
        ;
        goto LAB_001567a9;
      }
      if ((int)pEVar1[1].loc.filename.size_ != 0) goto LAB_00156680;
      pSVar11 = this->stream_;
      uVar5 = pEVar1[1].loc.field_1.field_0.line;
      pcVar9 = "throw event";
      break;
    case Try:
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      WriteOpcode(this->stream_,(Opcode)0x7);
      exprs_00 = (ExprList *)&pEVar1[4].loc;
      goto LAB_00156395;
    case Last:
      pSVar11 = this->stream_;
      OVar10.enum_ = Unreachable;
LAB_001563a2:
      WriteOpcode(pSVar11,OVar10);
    default:
      goto switchD_001559fa_default;
    }
    WriteU32Leb128(pSVar11,uVar5,pcVar9);
switchD_001559fa_default:
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}